

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O0

size_t __thiscall CertificateList::SetDataSize(CertificateList *this)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  CertificateList *this_local;
  
  sVar1 = DerBase::EncodedSize(&(this->tbsCertList).super_DerBase);
  sVar2 = DerBase::EncodedSize(&(this->signatureAlgorithm).super_DerBase);
  sVar3 = DerBase::EncodedSize(&(this->signatureValue).super_DerBase);
  (this->super_DerBase).cbData = sVar1 + sVar2 + sVar3;
  return (this->super_DerBase).cbData;
}

Assistant:

virtual size_t SetDataSize() override
	{
		cbData = tbsCertList.EncodedSize() + signatureAlgorithm.EncodedSize() + signatureValue.EncodedSize();
		return cbData;
	}